

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RtreeSearchPoint * rtreeSearchPointNew(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  double dVar1;
  u8 uVar2;
  sqlite3_int64 sVar3;
  u8 uVar4;
  undefined5 uVar5;
  RtreeSearchPoint *pRVar6;
  long lVar7;
  
  uVar2 = pCur->bPoint;
  if (uVar2 == '\0') {
    if (pCur->nPoint == 0) {
      pCur->anQueue[iLevel] = pCur->anQueue[iLevel] + 1;
      goto LAB_001cb84f;
    }
    pRVar6 = pCur->aPoint;
    pCur->anQueue[iLevel] = pCur->anQueue[iLevel] + 1;
    if (pRVar6 == (RtreeSearchPoint *)0x0) goto LAB_001cb84f;
  }
  else {
    pRVar6 = &pCur->sPoint;
    pCur->anQueue[iLevel] = pCur->anQueue[iLevel] + 1;
  }
  dVar1 = pRVar6->rScore;
  if ((dVar1 <= rScore) &&
     (((dVar1 != rScore || (NAN(dVar1) || NAN(rScore))) || (pRVar6->iLevel <= iLevel)))) {
    pRVar6 = rtreeEnqueue(pCur,rScore,iLevel);
    return pRVar6;
  }
  if (uVar2 != '\0') {
    pRVar6 = rtreeEnqueue(pCur,rScore,iLevel);
    if (pRVar6 == (RtreeSearchPoint *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    lVar7 = ((long)pRVar6 - (long)pCur->aPoint >> 3) * -0x5555555555555555;
    if ((int)lVar7 < 4) {
      *(RtreeNode **)((long)pCur->aNode + ((lVar7 << 0x20) + 0x100000000 >> 0x1d)) = pCur->aNode[0];
    }
    else {
      nodeRelease((Rtree *)(pCur->base).pVtab,pCur->aNode[0]);
    }
    pCur->aNode[0] = (RtreeNode *)0x0;
    uVar2 = (pCur->sPoint).eWithin;
    uVar4 = (pCur->sPoint).iCell;
    uVar5 = *(undefined5 *)&(pCur->sPoint).field_0x13;
    pRVar6->iLevel = (pCur->sPoint).iLevel;
    pRVar6->eWithin = uVar2;
    pRVar6->iCell = uVar4;
    *(undefined5 *)&pRVar6->field_0x13 = uVar5;
    sVar3 = (pCur->sPoint).id;
    pRVar6->rScore = (pCur->sPoint).rScore;
    pRVar6->id = sVar3;
  }
LAB_001cb84f:
  (pCur->sPoint).rScore = rScore;
  (pCur->sPoint).iLevel = iLevel;
  pCur->bPoint = '\x01';
  return &pCur->sPoint;
}

Assistant:

static RtreeSearchPoint *rtreeSearchPointNew(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  RtreeSearchPoint *pNew, *pFirst;
  pFirst = rtreeSearchPointFirst(pCur);
  pCur->anQueue[iLevel]++;
  if( pFirst==0
   || pFirst->rScore>rScore 
   || (pFirst->rScore==rScore && pFirst->iLevel>iLevel)
  ){
    if( pCur->bPoint ){
      int ii;
      pNew = rtreeEnqueue(pCur, rScore, iLevel);
      if( pNew==0 ) return 0;
      ii = (int)(pNew - pCur->aPoint) + 1;
      if( ii<RTREE_CACHE_SZ ){
        assert( pCur->aNode[ii]==0 );
        pCur->aNode[ii] = pCur->aNode[0];
      }else{
        nodeRelease(RTREE_OF_CURSOR(pCur), pCur->aNode[0]);
      }
      pCur->aNode[0] = 0;
      *pNew = pCur->sPoint;
    }
    pCur->sPoint.rScore = rScore;
    pCur->sPoint.iLevel = iLevel;
    pCur->bPoint = 1;
    return &pCur->sPoint;
  }else{
    return rtreeEnqueue(pCur, rScore, iLevel);
  }
}